

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  char *__s;
  undefined8 *puVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  time_t tVar7;
  size_t sVar8;
  Cookie *pCVar9;
  char *__s_00;
  char *pcVar10;
  size_t sVar11;
  undefined8 *__base;
  long lVar12;
  Cookie *pCVar13;
  Cookie *pCVar14;
  Cookie *pCVar15;
  Cookie *pCVar16;
  byte bVar17;
  size_t local_50;
  undefined1 local_34 [4];
  
  bVar17 = 0;
  tVar7 = time((time_t *)0x0);
  if (c == (CookieInfo *)0x0) {
    return (Cookie *)0x0;
  }
  if (c->cookies != (Cookie *)0x0) {
    remove_expired(c);
    iVar5 = inet_pton(2,host,local_34);
    pCVar16 = c->cookies;
    if (pCVar16 != (Cookie *)0x0) {
      local_50 = 0;
      pCVar13 = (Cookie *)0x0;
      do {
        if (((pCVar16->expires == 0) || (tVar7 < pCVar16->expires)) &&
           ((byte)(pCVar16->secure ^ 1U | secure) == 1)) {
          if (pCVar16->domain != (char *)0x0) {
            bVar3 = pCVar16->tailmatch ^ 1;
            if (iVar5 == 0 && bVar3 == 0) {
              _Var4 = tailmatch(pCVar16->domain,host);
              if (_Var4) goto LAB_00555557;
              bVar3 = pCVar16->tailmatch ^ 1;
            }
            if ((iVar5 == 0 && (bVar3 & 1) == 0) ||
               (iVar6 = Curl_raw_equal(host,pCVar16->domain), iVar6 == 0)) goto LAB_005555a8;
          }
LAB_00555557:
          __s = pCVar16->spath;
          if ((__s == (char *)0x0) || (sVar8 = strlen(__s), sVar8 == 1)) goto LAB_0055556f;
          __s_00 = (*Curl_cstrdup)(path);
          if (__s_00 != (char *)0x0) {
            pcVar10 = strchr(__s_00,0x3f);
            if (pcVar10 != (char *)0x0) {
              *pcVar10 = '\0';
            }
            if (*__s_00 != '/') {
              (*Curl_cfree)(__s_00);
              __s_00 = (*Curl_cstrdup)("/");
              if (__s_00 == (char *)0x0) goto LAB_005555a8;
            }
            sVar11 = strlen(__s_00);
            if ((sVar11 < sVar8) || (iVar6 = strncmp(__s,__s_00,sVar8), iVar6 != 0)) {
              (*Curl_cfree)(__s_00);
            }
            else {
              if (sVar8 == sVar11) {
                (*Curl_cfree)(__s_00);
              }
              else {
                cVar1 = __s_00[sVar8];
                (*Curl_cfree)(__s_00);
                if (cVar1 != '/') goto LAB_005555a8;
              }
LAB_0055556f:
              pCVar9 = (Cookie *)(*Curl_cmalloc)(0x60);
              if (pCVar9 == (Cookie *)0x0) goto joined_r0x00555719;
              pCVar14 = pCVar16;
              pCVar15 = pCVar9;
              for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
                pCVar15->next = pCVar14->next;
                pCVar14 = (Cookie *)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
                pCVar15 = (Cookie *)((long)pCVar15 + (ulong)bVar17 * -0x10 + 8);
              }
              pCVar9->next = pCVar13;
              local_50 = local_50 + 1;
              pCVar13 = pCVar9;
            }
          }
        }
LAB_005555a8:
        pCVar16 = pCVar16->next;
      } while (pCVar16 != (Cookie *)0x0);
      if (local_50 == 0) {
        return pCVar13;
      }
      __base = (undefined8 *)(*Curl_cmalloc)(local_50 * 8);
      puVar2 = __base;
      if (__base != (undefined8 *)0x0) {
        for (; pCVar13 != (Cookie *)0x0; pCVar13 = pCVar13->next) {
          *puVar2 = pCVar13;
          puVar2 = puVar2 + 1;
        }
        qsort(__base,local_50,8,cookie_sort);
        pCVar16 = (Cookie *)*__base;
        if (local_50 != 1) {
          sVar8 = 1;
          pCVar13 = pCVar16;
          do {
            pCVar9 = (Cookie *)__base[sVar8];
            pCVar13->next = pCVar9;
            sVar8 = sVar8 + 1;
            pCVar13 = pCVar9;
          } while (local_50 != sVar8);
        }
        *(undefined8 *)__base[local_50 - 1] = 0;
        (*Curl_cfree)(__base);
        return pCVar16;
      }
joined_r0x00555719:
      while (pCVar13 != (Cookie *)0x0) {
        pCVar16 = pCVar13->next;
        (*Curl_cfree)(pCVar13);
        pCVar13 = pCVar16;
      }
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  time_t now = time(NULL);
  struct Cookie *mainco=NULL;
  size_t matches = 0;
  bool is_ip;

  if(!c || !c->cookies)
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies;

  while(co) {
    /* only process this cookie if it is not expired or had no expire
       date AND that if the cookie requires we're secure we must only
       continue if we are! */
    if((!co->expires || (co->expires > now)) &&
       (co->secure?secure:TRUE)) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && Curl_raw_equal(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = malloc(sizeof(struct Cookie));
          if(newco) {
            /* first, copy the whole source cookie: */
            memcpy(newco, co, sizeof(struct Cookie));

            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else {
            fail:
            /* failure, clear up the allocated chain and return NULL */
            while(mainco) {
              co = mainco->next;
              free(mainco);
              mainco = co;
            }

            return NULL;
          }
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i=0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i=0; i<matches-1; i++)
      array[i]->next = array[i+1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */
}